

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  ostream *this;
  undefined1 local_40 [8];
  Sample_t<kiste::terminal_t,_Data,_Serializer> sample;
  Serializer serializer;
  ostream *os;
  Data data;
  
  os._4_4_ = 0;
  os._3_1_ = 0;
  Serializer::Serializer((Serializer *)&sample._serialize,(ostream *)&std::cout);
  test::Sample_generator::operator()
            ((Sample_t<kiste::terminal_t,_Data,_Serializer> *)local_40,
             (Sample_generator *)&test::Sample,(Data *)((long)&os + 3),
             (Serializer *)&sample._serialize);
  test::Sample_t<kiste::terminal_t,_Data,_Serializer>::render
            ((Sample_t<kiste::terminal_t,_Data,_Serializer> *)local_40);
  if (((((byte)serializer.super_raw._os & 1) == 0) || ((serializer.super_raw._os._1_1_ & 1) == 0))
     || ((serializer.super_raw._os._2_1_ & 1) == 0)) {
    this = std::operator<<((ostream *)&std::cerr,"Missed some expected exception! Please inspect");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    os._4_4_ = 1;
  }
  return os._4_4_;
}

Assistant:

int main()
{
  const auto data = Data{};
  auto& os = std::cout;
  auto serializer = Serializer{os};
  auto sample = test::Sample(data, serializer);

  sample.render();
  if (not(serializer.caughtInt and serializer.caughtString and serializer.caughtException))
  {
    std::cerr << "Missed some expected exception! Please inspect" << std::endl;
    return 1;
  }
}